

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

buffer_s * ox_buffer_new(size_t buffer_size)

{
  char *pcVar1;
  buffer_s *local_20;
  buffer_s *ret;
  size_t buffer_size_local;
  
  local_20 = (buffer_s *)malloc(0x20);
  if (local_20 == (buffer_s *)0x0) {
    buffer_size_local = 0;
  }
  else {
    pcVar1 = (char *)malloc(buffer_size);
    local_20->data = pcVar1;
    if (pcVar1 == (char *)0x0) {
      ox_buffer_delete(local_20);
      local_20 = (buffer_s *)0x0;
    }
    else {
      local_20->data_len = buffer_size;
      local_20->read_pos = 0;
      local_20->write_pos = 0;
    }
    buffer_size_local = (size_t)local_20;
  }
  return (buffer_s *)buffer_size_local;
}

Assistant:

struct buffer_s* 
ox_buffer_new(size_t buffer_size)
{
    struct buffer_s* ret = (struct buffer_s*)malloc(sizeof(struct buffer_s));
    if(ret == NULL)
    {
        return NULL;
    }

    if ((ret->data = (char*)malloc(sizeof(char)*buffer_size)) != NULL)
    {
        ret->data_len = buffer_size;
        ret->read_pos = 0;
        ret->write_pos = 0;
    }
    else
    {
        ox_buffer_delete(ret);
        ret = NULL;
    }

    return ret;
}